

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBTensorOp.cpp
# Opt level: O1

void __thiscall amrex::MLEBTensorOp::prepareForSolve(MLEBTensorOp *this)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  pointer paVar4;
  pointer paVar5;
  long lVar6;
  pointer pMVar7;
  bool bVar8;
  pointer pVVar9;
  ulong uVar10;
  pointer pVVar11;
  pointer pVVar12;
  long lVar13;
  pointer pMVar14;
  long lVar15;
  long lVar16;
  int idim;
  long lVar17;
  long lVar18;
  Array<const_MultiFab_*,_3> local_78;
  ulong local_60;
  IntVect local_54;
  Array<MultiFab_*,_3> local_48;
  
  if ((this->super_MLEBABecLap).field_0x3d5 != (this->super_MLEBABecLap).field_0x3d6) {
    Assert_host("m_has_kappa == m_has_eb_kappa",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLEBTensorOp.cpp"
                ,0x8f,
                "\"MLEBTensorOp: must call both setBulkViscosity and setEBBulkViscosity or none.\"")
    ;
  }
  uVar3 = (this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.
          m_num_amr_levels;
  if ((this->super_MLEBABecLap).field_0x3d5 == '\0') {
    if (0 < (int)uVar3) {
      lVar16 = 0;
      do {
        pVVar9 = (this->m_kappa).
                 super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                 .
                 super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        paVar4 = *(pointer *)
                  ((long)&pVVar9[lVar16].
                          super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                          .
                          super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                  + 8);
        paVar5 = *(pointer *)
                  &pVVar9[lVar16].
                   super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                   .
                   super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
        ;
        if (paVar4 != paVar5 && -1 < (long)paVar4 - (long)paVar5) {
          lVar15 = 0xc0;
          lVar17 = 0;
          do {
            lVar18 = 3;
            lVar13 = lVar15;
            do {
              lVar6 = *(long *)&(this->m_kappa).
                                super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                                .
                                super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar16].
                                super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                .
                                super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              ;
              lVar2 = lVar6 + lVar13;
              FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                        ((FabArray<amrex::FArrayBox> *)(lVar2 + -0xc0),0.0,0,*(int *)(lVar2 + 0xc),
                         (IntVect *)(lVar6 + lVar13));
              lVar13 = lVar13 + 0x180;
              lVar18 = lVar18 + -1;
            } while (lVar18 != 0);
            lVar17 = lVar17 + 1;
            pVVar9 = (this->m_kappa).
                     super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar13 = ((long)*(pointer *)
                             ((long)&pVVar9[lVar16].
                                     super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                     .
                                     super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                             + 8) -
                      *(long *)&pVVar9[lVar16].
                                super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                .
                                super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                     >> 7) * -0x71c71c71c71c71c7;
            lVar15 = lVar15 + 0x480;
          } while (lVar13 - lVar17 != 0 && lVar17 <= lVar13);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < (this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.
                        super_MLLinOp.m_num_amr_levels);
    }
  }
  else if (0 < (int)uVar3) {
    uVar10 = (ulong)uVar3;
    do {
      uVar1 = uVar10 - 1;
      pVVar9 = (this->m_kappa).
               super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
               .
               super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_60 = uVar1;
      if (0x480 < (long)*(pointer *)
                         ((long)&pVVar9[uVar1].
                                 super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                 .
                                 super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                         + 8) -
                  *(long *)&pVVar9[uVar1].
                            super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                            .
                            super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
         ) {
        pVVar12 = pVVar9 + uVar1;
        lVar16 = 1;
        lVar17 = 0x780;
        do {
          lVar15 = *(long *)&(pVVar12->
                             super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                             ).
                             super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
          ;
          local_78._M_elems[0] = (MultiFab *)(lVar15 + lVar17 + -0x780);
          local_78._M_elems[1] = (MultiFab *)(lVar15 + -0x600 + lVar17);
          local_78._M_elems[2] = (MultiFab *)(lVar15 + -0x480 + lVar17);
          lVar15 = *(long *)&(pVVar12->
                             super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                             ).
                             super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
          ;
          local_48._M_elems[2] = (MultiFab *)(lVar15 + lVar17);
          local_48._M_elems[0] = (MultiFab *)(lVar15 + -0x300 + lVar17);
          local_48._M_elems[1] = (MultiFab *)(lVar15 + -0x180 + lVar17);
          local_54.vect[0] = 2;
          local_54.vect[1] = 2;
          local_54.vect[2] = 2;
          EB_average_down_faces(&local_78,&local_48,&local_54,0);
          lVar16 = lVar16 + 1;
          pVVar9 = (this->m_kappa).
                   super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                   .
                   super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pVVar12 = pVVar9 + uVar1;
          lVar15 = ((long)*(pointer *)
                           ((long)&(pVVar12->
                                   super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                   ).
                                   super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                           + 8) -
                    *(long *)&(pVVar12->
                              super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                              ).
                              super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                   >> 7) * -0x71c71c71c71c71c7;
          lVar17 = lVar17 + 0x480;
        } while (lVar15 - lVar16 != 0 && lVar16 <= lVar15);
      }
      if (uVar10 != 1) {
        paVar4 = *(pointer *)
                  ((long)&pVVar9[uVar1].
                          super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                          .
                          super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                  + 8);
        local_78._M_elems[0] = paVar4[-1]._M_elems;
        local_78._M_elems[1] = paVar4[-1]._M_elems + 1;
        local_78._M_elems[2] = paVar4[-1]._M_elems + 2;
        local_48._M_elems[0] =
             *(MultiFab **)
              &pVVar9[uVar10 - 2].
               super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
               .
               super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
        ;
        local_48._M_elems[1] = local_48._M_elems[0] + 1;
        local_48._M_elems[2] = local_48._M_elems[0] + 2;
        local_54.vect[0] = 2;
        local_54.vect[1] = 2;
        local_54.vect[2] = 2;
        EB_average_down_faces
                  (&local_78,&local_48,&local_54,
                   *(Geometry **)
                    &(this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.
                     m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar10 - 2].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>);
      }
      bVar8 = 1 < (long)uVar10;
      uVar10 = local_60;
    } while (bVar8);
  }
  uVar3 = (this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.
          m_num_amr_levels;
  if ((this->super_MLEBABecLap).field_0x3d6 == '\0') {
    if (0 < (int)uVar3) {
      lVar16 = 0;
      do {
        pVVar11 = (this->m_eb_kappa).
                  super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                  .
                  super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pMVar14 = *(pointer *)
                   &pVVar11[lVar16].super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                    super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>;
        pMVar7 = *(pointer *)
                  ((long)&pVVar11[lVar16].
                          super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                          super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> + 8)
        ;
        if (pMVar7 != pMVar14 && -1 < (long)pMVar7 - (long)pMVar14) {
          lVar15 = 0xc0;
          lVar17 = 0;
          do {
            FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                      ((FabArray<amrex::FArrayBox> *)((long)pMVar14 + lVar15 + -0xc0),0.0,0,
                       *(int *)((long)&(pMVar14->super_FabArray<amrex::FArrayBox>).
                                       super_FabArrayBase + lVar15 + 0xc),
                       (IntVect *)
                       ((long)&(pMVar14->super_FabArray<amrex::FArrayBox>).super_FabArrayBase +
                       lVar15));
            lVar17 = lVar17 + 1;
            pVVar11 = (this->m_eb_kappa).
                      super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                      .
                      super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pMVar14 = *(pointer *)
                       &pVVar11[lVar16].
                        super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                        super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>;
            lVar13 = ((long)*(pointer *)
                             ((long)&pVVar11[lVar16].
                                     super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                     .
                                     super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                             + 8) - (long)pMVar14 >> 7) * -0x5555555555555555;
            lVar15 = lVar15 + 0x180;
          } while (lVar13 - lVar17 != 0 && lVar17 <= lVar13);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < (this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.
                        super_MLLinOp.m_num_amr_levels);
    }
  }
  else if (0 < (int)uVar3) {
    uVar10 = (ulong)uVar3;
    do {
      uVar1 = uVar10 - 1;
      pVVar11 = (this->m_eb_kappa).
                super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                .
                super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar16 = *(long *)&pVVar11[uVar1].
                         super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                         super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>;
      pMVar14 = *(pointer *)
                 ((long)&pVVar11[uVar1].
                         super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                         super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> + 8);
      local_60 = uVar1;
      if (0x180 < (long)pMVar14 - lVar16) {
        lVar15 = 1;
        lVar17 = 0x180;
        do {
          local_78._M_elems[0] = (MultiFab *)0x200000002;
          local_78._M_elems[1] = (MultiFab *)CONCAT44(local_78._M_elems[1]._4_4_,2);
          EB_average_down_boundaries
                    ((MultiFab *)(lVar16 + lVar17 + -0x180),(MultiFab *)(lVar16 + lVar17),
                     (IntVect *)&local_78,0);
          lVar15 = lVar15 + 1;
          pVVar11 = (this->m_eb_kappa).
                    super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar16 = *(long *)&pVVar11[uVar1].
                             super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                             super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>;
          pMVar14 = *(pointer *)
                     ((long)&pVVar11[uVar1].
                             super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                             super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> +
                     8);
          lVar13 = ((long)pMVar14 - lVar16 >> 7) * -0x5555555555555555;
          lVar17 = lVar17 + 0x180;
        } while (lVar13 - lVar15 != 0 && lVar15 <= lVar13);
      }
      if (uVar10 != 1) {
        local_78._M_elems[0] = (MultiFab *)0x200000002;
        local_78._M_elems[1] = (MultiFab *)CONCAT44(local_78._M_elems[1]._4_4_,2);
        EB_average_down_boundaries
                  (pMVar14 + -1,
                   *(MultiFab **)
                    &pVVar11[uVar10 - 2].
                     super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                     super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,
                   (IntVect *)&local_78,0);
      }
      bVar8 = 1 < (long)uVar10;
      uVar10 = local_60;
    } while (bVar8);
  }
  if (0 < (this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.
          m_num_amr_levels) {
    lVar16 = 0;
    do {
      lVar17 = 0;
      lVar15 = 0;
      do {
        MultiFab::Xpay((MultiFab *)
                       (*(long *)&(this->super_MLEBABecLap).m_b_coeffs.
                                  super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                                  .
                                  super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar16].
                                  super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                  .
                                  super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                       + lVar17),1.3333333333333333,
                       (MultiFab *)
                       (*(long *)&(this->m_kappa).
                                  super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                                  .
                                  super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar16].
                                  super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                  .
                                  super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                       + lVar17),0,(int)lVar15,1,0);
        lVar15 = lVar15 + 1;
        lVar17 = lVar17 + 0x180;
      } while (lVar15 != 3);
      lVar16 = lVar16 + 1;
    } while (lVar16 < (this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.
                      m_num_amr_levels);
  }
  MLEBABecLap::prepareForSolve(&this->super_MLEBABecLap);
  return;
}

Assistant:

void
MLEBTensorOp::prepareForSolve ()
{
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(m_has_kappa == m_has_eb_kappa,
        "MLEBTensorOp: must call both setBulkViscosity and setEBBulkViscosity or none.");

    if (m_has_kappa) {
        for (int amrlev = NAMRLevels()-1; amrlev >= 0; --amrlev) {
            for (int mglev = 1; mglev < m_kappa[amrlev].size(); ++mglev) {
                amrex::EB_average_down_faces(GetArrOfConstPtrs(m_kappa[amrlev][mglev-1]),
                                             GetArrOfPtrs     (m_kappa[amrlev][mglev  ]),
                                             IntVect(mg_coarsen_ratio), 0);
            }
            if (amrlev > 0) {
                amrex::EB_average_down_faces(GetArrOfConstPtrs(m_kappa[amrlev  ].back()),
                                             GetArrOfPtrs     (m_kappa[amrlev-1].front()),
                                             IntVect(mg_coarsen_ratio), m_geom[amrlev-1][0]);
            }
        }
    } else {
        for (int amrlev = 0; amrlev < NAMRLevels(); ++amrlev) {
            for (int mglev = 0; mglev < m_kappa[amrlev].size(); ++mglev) {
                for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                    m_kappa[amrlev][mglev][idim].setVal(0.0);
                }
            }
        }
    }

    if (m_has_eb_kappa) {
        for (int amrlev = NAMRLevels()-1; amrlev >= 0; --amrlev) {
            for (int mglev = 1; mglev < m_eb_kappa[amrlev].size(); ++mglev) {
                amrex::EB_average_down_boundaries(m_eb_kappa[amrlev][mglev-1],
                                                  m_eb_kappa[amrlev][mglev  ],
                                                  IntVect(mg_coarsen_ratio), 0);
            }
            if (amrlev > 0) {
                amrex::EB_average_down_boundaries(m_eb_kappa[amrlev  ].back(),
                                                  m_eb_kappa[amrlev-1].front(),
                                                  IntVect(mg_coarsen_ratio), 0);
            }
        }
    } else {
        for (int amrlev = 0; amrlev < NAMRLevels(); ++amrlev) {
            for (int mglev = 0; mglev < m_eb_kappa[amrlev].size(); ++mglev) {
                m_eb_kappa[amrlev][mglev].setVal(0.0);
            }
        }
    }

    for (int amrlev = 0; amrlev < NAMRLevels(); ++amrlev) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            int icomp = idim;
            MultiFab::Xpay(m_b_coeffs[amrlev][0][idim], 4./3.,
                           m_kappa[amrlev][0][idim], 0, icomp, 1, 0);
        }
    }

    MLEBABecLap::prepareForSolve();
}